

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitFunction(I64ToI32Lowering *this,Function *func)

{
  char **__return_storage_ptr__;
  Builder *pBVar1;
  char *pcVar2;
  undefined1 func_00 [8];
  size_t sVar3;
  bool bVar4;
  Index IVar5;
  LocalSet *any;
  LocalGet *pLVar6;
  GlobalSet *append;
  Block *pBVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  Type in_R8;
  int __val;
  Name name;
  Signature SVar10;
  Name name_00;
  undefined1 local_98 [8];
  Name tmpName;
  TempVar highBits;
  TempVar lowBits;
  
  if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    SVar10 = HeapType::getSignature(&func->type);
    if (SVar10.results.id.id == 3) {
      Function::setResults(func,(Type)0x2);
      bVar4 = hasOutParam(this,func->body);
      if (bVar4) {
        fetchOutParam((TempVar *)&tmpName.super_IString.str._M_str,this,func->body);
        getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
        pBVar1 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
        any = Builder::makeLocalSet(pBVar1,IVar5,func->body);
        pcVar2 = DAT_01174df8;
        sVar8 = INT64_TO_32_HIGH_BITS;
        pBVar1 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)&tmpName.super_IString.str._M_str)
        ;
        pLVar6 = Builder::makeLocalGet(pBVar1,IVar5,(Type)0x2);
        name.super_IString.str._M_str = pcVar2;
        name.super_IString.str._M_len = sVar8;
        append = Builder::makeGlobalSet(pBVar1,name,(Expression *)pLVar6);
        pBVar1 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
        pLVar6 = Builder::makeLocalGet(pBVar1,IVar5,(Type)0x2);
        pBVar7 = Builder::blockify<wasm::LocalGet*>
                           ((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                            (Expression *)any,(Expression *)append,pLVar6);
        func->body = (Expression *)pBVar7;
        TempVar::~TempVar((TempVar *)&highBits.ty);
        TempVar::~TempVar((TempVar *)&tmpName.super_IString.str._M_str);
      }
    }
    sVar8 = Function::getNumLocals(func);
    __val = 0;
    __return_storage_ptr__ = &tmpName.super_IString.str._M_str;
    for (; sVar8 < this->nextTemp; sVar8 = sVar8 + 1) {
      std::__cxx11::to_string((string *)&highBits.ty,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,"i64toi32_i32$",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &highBits.ty);
      IString::IString((IString *)local_98,(string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&highBits.ty);
      sVar3 = tmpName.super_IString.str._M_len;
      func_00 = local_98;
      tmpName.super_IString.str._M_str._0_4_ = (undefined4)sVar8;
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Type>,_std::allocator<std::pair<const_unsigned_int,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Type>,_std::allocator<std::pair<const_unsigned_int,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->tempTypes,(key_type *)__return_storage_ptr__);
      name_00.super_IString.str._M_str = (char *)pmVar9->id;
      name_00.super_IString.str._M_len = sVar3;
      Builder::addVar((Builder *)func,(Function *)func_00,name_00,in_R8);
      __val = __val + 1;
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    if (func->getResults() == Type::i64) {
      func->setResults(Type::i32);
      // body may not have out param if it ends with control flow
      if (hasOutParam(func->body)) {
        TempVar highBits = fetchOutParam(func->body);
        TempVar lowBits = getTemp();
        LocalSet* setLow = builder->makeLocalSet(lowBits, func->body);
        GlobalSet* setHigh = builder->makeGlobalSet(
          INT64_TO_32_HIGH_BITS, builder->makeLocalGet(highBits, Type::i32));
        LocalGet* getLow = builder->makeLocalGet(lowBits, Type::i32);
        func->body = builder->blockify(setLow, setHigh, getLow);
      }
    }
    int idx = 0;
    for (size_t i = func->getNumLocals(); i < nextTemp; i++) {
      Name tmpName("i64toi32_i32$" + std::to_string(idx++));
      builder->addVar(func, tmpName, tempTypes[i]);
    }
  }